

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

CSAT_StatusT ABC_Solve(ABC_Manager mng)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  CSAT_Target_ResultT *pCVar4;
  char **ppcVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  Abc_Ntk_t *pNtk;
  
  if (mng->pTarget == (Abc_Ntk_t *)0x0) {
    puts("ABC_Solve: Target network is not derived by ABC_SolveInit().");
    return UNDETERMINED;
  }
  if (mng->mode == 0) {
    iVar3 = Abc_NtkIvyProve(&mng->pTarget,&mng->Params);
  }
  else {
    iVar3 = Abc_NtkMiterSat(mng->pTarget,(long)(mng->Params).nMiteringLimitLast,0,0,
                            (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
  }
  pNtk = mng->pTarget;
  iVar1 = pNtk->vCis->nSize;
  pCVar4 = (CSAT_Target_ResultT *)calloc(1,0x38);
  pCVar4->no_sig = iVar1;
  ppcVar5 = (char **)calloc(1,(long)iVar1 * 8);
  pCVar4->names = ppcVar5;
  piVar6 = (int *)calloc(1,(long)iVar1 << 2);
  pCVar4->values = piVar6;
  mng->pResult = pCVar4;
  if (iVar3 != -1) {
    if (iVar3 == 0) {
      pCVar4->status = SATISFIABLE;
      if (iVar1 < 1) {
        piVar6 = pNtk->pModel;
        if (piVar6 == (int *)0x0) goto LAB_0050019a;
      }
      else {
        lVar8 = 0;
        do {
          pVVar2 = mng->pNtk->vCis;
          if (pVVar2->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar7 = ABC_GetNodeName((ABC_Manager)mng->tNode2Name,(Abc_Obj_t *)pVVar2->pArray[lVar8]);
          pcVar7 = Extra_UtilStrsav(pcVar7);
          mng->pResult->names[lVar8] = pcVar7;
          pCVar4 = mng->pResult;
          piVar6 = mng->pTarget->pModel;
          pCVar4->values[lVar8] = piVar6[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 < pCVar4->no_sig);
      }
      free(piVar6);
      pNtk = mng->pTarget;
      pNtk->pModel = (int *)0x0;
    }
    else {
      if (iVar3 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                      ,0x284,"enum CSAT_StatusT ABC_Solve(ABC_Manager)");
      }
      pCVar4->status = UNSATISFIABLE;
    }
  }
LAB_0050019a:
  Abc_NtkDelete(pNtk);
  mng->pTarget = (Abc_Ntk_t *)0x0;
  return mng->pResult->status;
}

Assistant:

enum CSAT_StatusT ABC_Solve( ABC_Manager mng )
{
    Prove_Params_t * pParams = &mng->Params;
    int RetValue, i;

    // check if the target network is available
    if ( mng->pTarget == NULL )
        { printf( "ABC_Solve: Target network is not derived by ABC_SolveInit().\n" ); return UNDETERMINED; }

    // try to prove the miter using a number of techniques
    if ( mng->mode )
        RetValue = Abc_NtkMiterSat( mng->pTarget, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
    else
//        RetValue = Abc_NtkMiterProve( &mng->pTarget, pParams ); // old CEC engine
        RetValue = Abc_NtkIvyProve( &mng->pTarget, pParams ); // new CEC engine

    // analyze the result
    mng->pResult = ABC_TargetResAlloc( Abc_NtkCiNum(mng->pTarget) );
    if ( RetValue == -1 )
        mng->pResult->status = UNDETERMINED;
    else if ( RetValue == 1 )
        mng->pResult->status = UNSATISFIABLE;
    else if ( RetValue == 0 )
    {
        mng->pResult->status = SATISFIABLE;
        // create the array of PI names and values
        for ( i = 0; i < mng->pResult->no_sig; i++ )
        {
            mng->pResult->names[i]  = Extra_UtilStrsav( ABC_GetNodeName(mng, Abc_NtkCi(mng->pNtk, i)) ); 
            mng->pResult->values[i] = mng->pTarget->pModel[i];
        }
        ABC_FREE( mng->pTarget->pModel );
    }
    else assert( 0 );

    // delete the target
    Abc_NtkDelete( mng->pTarget );
    mng->pTarget = NULL;
    // return the status
    return mng->pResult->status;
}